

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ObjCHelper_IsInitName_Test::
~ObjCHelper_IsInitName_Test(ObjCHelper_IsInitName_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjCHelper, IsInitName) {
  EXPECT_TRUE(IsInitName("init"));
  EXPECT_TRUE(IsInitName("initFoo"));
  EXPECT_TRUE(IsInitName("init_foo"));

  EXPECT_FALSE(IsInitName(""));
  EXPECT_FALSE(IsInitName("in"));
  EXPECT_FALSE(IsInitName("Init"));
  EXPECT_FALSE(IsInitName("inIt"));
  EXPECT_FALSE(IsInitName("initial"));
  EXPECT_FALSE(IsInitName("initiAl"));
  EXPECT_FALSE(IsInitName("fooInit"));
  EXPECT_FALSE(IsInitName("foo_init"));

  EXPECT_FALSE(IsInitName("new"));
  EXPECT_FALSE(IsInitName("alloc"));
  EXPECT_FALSE(IsInitName("copy"));
  EXPECT_FALSE(IsInitName("mutableCopy"));
  EXPECT_FALSE(IsInitName("Create"));
  EXPECT_FALSE(IsInitName("Copy"));
}